

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Builder<prometheus::Counter> * prometheus::BuildCounter(void)

{
  Builder<prometheus::Counter> *in_RDI;
  
  memset(in_RDI,0,0x70);
  detail::Builder<prometheus::Counter>::Builder(in_RDI);
  return in_RDI;
}

Assistant:

detail::Builder<Counter> BuildCounter() { return {}; }